

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O2

int * __thiscall ED::sortAnchorsByGradValue1(ED *this)

{
  size_t __n;
  int iVar1;
  int iVar2;
  int i;
  void *__s;
  uchar *puVar3;
  int *piVar4;
  short *psVar5;
  short *psVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int j_1;
  long lVar11;
  long lVar12;
  uchar *puVar13;
  
  __s = operator_new__(0x20000);
  memset(__s,0,0x20000);
  lVar11 = (long)this->height + -1;
  iVar1 = this->width;
  lVar12 = (long)iVar1;
  puVar13 = this->edgeImg;
  psVar6 = this->gradImg;
  puVar3 = puVar13;
  psVar5 = psVar6;
  for (lVar8 = 1; psVar5 = psVar5 + lVar12, puVar3 = puVar3 + lVar12, lVar9 = 1, lVar8 < lVar11;
      lVar8 = lVar8 + 1) {
    for (; lVar9 < lVar12 + -1; lVar9 = lVar9 + 1) {
      if (puVar3[lVar9] == 0xfe) {
        piVar4 = (int *)((long)__s + (long)psVar5[lVar9] * 4);
        *piVar4 = *piVar4 + 1;
      }
    }
  }
  for (lVar8 = 1; lVar8 != 0x8000; lVar8 = lVar8 + 1) {
    piVar4 = (int *)((long)__s + lVar8 * 4);
    *piVar4 = *piVar4 + *(int *)((long)__s + lVar8 * 4 + -4);
  }
  __n = (long)*(int *)((long)__s + 0x1fffc) * 4;
  uVar10 = 0xffffffffffffffff;
  if (-1 < (long)*(int *)((long)__s + 0x1fffc)) {
    uVar10 = __n;
  }
  piVar4 = (int *)operator_new__(uVar10);
  memset(piVar4,0,__n);
  iVar7 = iVar1;
  for (lVar8 = 1; psVar6 = psVar6 + lVar12, puVar13 = puVar13 + lVar12, lVar9 = 1, lVar8 < lVar11;
      lVar8 = lVar8 + 1) {
    for (; lVar9 < lVar12 + -1; lVar9 = lVar9 + 1) {
      if (puVar13[lVar9] == 0xfe) {
        iVar2 = *(int *)((long)__s + (long)psVar6[lVar9] * 4);
        *(int *)((long)__s + (long)psVar6[lVar9] * 4) = iVar2 + -1;
        piVar4[(long)iVar2 + -1] = iVar7 + (int)lVar9;
      }
    }
    iVar7 = iVar7 + iVar1;
  }
  operator_delete__(__s);
  return piVar4;
}

Assistant:

int * ED::sortAnchorsByGradValue1()
{
	int SIZE = 128 * 256;
	int *C = new int[SIZE];
	memset(C, 0, sizeof(int)*SIZE);

	// Count the number of grad values
	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			C[grad]++;
		} //end-for
	} //end-for 

	// Compute indices
	for (int i = 1; i<SIZE; i++) C[i] += C[i - 1];

	int noAnchors = C[SIZE - 1];
	int *A = new int[noAnchors];
	memset(A, 0, sizeof(int)*noAnchors);


	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			int index = --C[grad];
			A[index] = i*width + j;    // anchor's offset 
		} //end-for
	} //end-for  

	delete[] C;

	/*
	ofstream myFile;
	myFile.open("aNew.txt");
	for (int i = 0; i < noAnchors; i++)
		myFile << A[i] << endl;

	myFile.close(); */

	return A;

}